

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_dependentFunctionType_primitiveAnalyzeAndTypeCheckMessageSendNode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  bool bVar1;
  _Bool _Var2;
  size_t argumentNode;
  size_t slotCount;
  sysbvm_bitflags_t sVar3;
  sysbvm_tuple_t sVar4;
  bool bVar5;
  size_t sStack_1e8;
  _Bool isReceiverArgument;
  size_t i;
  ulong uStack_1d8;
  _Bool hasAnalyzedReceiver;
  size_t sourceArgumentIndex;
  size_t applicationArgumentCount;
  size_t directEvaluationArgumentNodeCount;
  size_t argumentNodeCount;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  sysbvm_stackFrameFunctionActivationRecord_t functionActivationRecord;
  anon_struct_72_9_c796e810 gcFrame;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_dependentFunctionType_t **dependentFunctionType;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 3) {
    sysbvm_error_argumentCountMismatch(3,argumentCount);
  }
  gcFrame.expectedArgumentType = (sysbvm_tuple_t)(arguments + 2);
  memset(functionActivationRecord.jmpbuffer[0].__saved_mask.__val + 0xf,0,0x48);
  functionActivationRecord.jmpbuffer[0].__saved_mask.__val[0xf] = arguments[1];
  memset(&gcFrameRecord.roots,0,0xf8);
  functionActivationRecord.previous._0_4_ = 1;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&gcFrameRecord.roots);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_COUNT;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)(functionActivationRecord.jmpbuffer[0].__saved_mask.__val + 0xf)
  ;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  argumentNodeCount = 0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ =
       *(undefined8 *)(functionActivationRecord.jmpbuffer[0].__saved_mask.__val[0xf] + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&argumentNodeCount);
  gcFrame.sendNode =
       (sysbvm_astMessageSendNode_t *)
       sysbvm_functionActivationEnvironment_createForDependentFunctionType(context,0,*arguments);
  argumentNode = sysbvm_array_getSize(*(sysbvm_tuple_t *)(*arguments + 0x108));
  slotCount = sysbvm_array_getSize
                        (*(sysbvm_tuple_t *)
                          (functionActivationRecord.jmpbuffer[0].__saved_mask.__val[0xf] + 0x40));
  uStack_1d8 = 0;
  bVar1 = false;
  gcFrame.analyzedArgument = sysbvm_array_create(context,slotCount);
  for (sStack_1e8 = 0; sStack_1e8 < argumentNode; sStack_1e8 = sStack_1e8 + 1) {
    gcFrame.applicationEnvironment =
         sysbvm_array_at(*(sysbvm_tuple_t *)(*arguments + 0x108),sStack_1e8);
    _Var2 = sysbvm_astArgumentNode_isForAll(argumentNode);
    if (_Var2) {
      sysbvm_error("TODO: Support forall argument types");
    }
    else {
      bVar5 = false;
      if (!bVar1) {
        bVar5 = *(long *)(functionActivationRecord.jmpbuffer[0].__saved_mask.__val[0xf] + 0x28) != 0
        ;
      }
      if (bVar5) {
        gcFrame.argumentNode =
             *(sysbvm_tuple_t *)
              (functionActivationRecord.jmpbuffer[0].__saved_mask.__val[0xf] + 0x28);
      }
      else {
        if (slotCount <= uStack_1d8) {
          sysbvm_error("Message send is missing required arguments.");
        }
        gcFrame.argumentNode =
             sysbvm_array_at(*(sysbvm_tuple_t *)
                              (functionActivationRecord.jmpbuffer[0].__saved_mask.__val[0xf] + 0x40)
                             ,uStack_1d8);
      }
      gcFrame.analyzedArguments =
           sysbvm_interpreter_evaluateArgumentNodeTypeInEnvironment
                     (context,gcFrame.applicationEnvironment,(sysbvm_tuple_t *)&gcFrame);
      gcFrame.resultType =
           sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                     (context,gcFrame.argumentNode,gcFrame.analyzedArguments,
                      *(sysbvm_tuple_t *)gcFrame.expectedArgumentType);
      if (bVar5) {
        *(sysbvm_tuple_t *)(functionActivationRecord.jmpbuffer[0].__saved_mask.__val[0xf] + 0x28) =
             gcFrame.resultType;
      }
      else {
        sysbvm_array_atPut(gcFrame.analyzedArgument,uStack_1d8,gcFrame.resultType);
      }
      gcFrame.applicationArgumentNode =
           sysbvm_dependentFunctionType_getOrCreateDependentApplicationValueForNode
                     (context,gcFrame.resultType);
      sysbvm_interpreter_bindArgumentNodeValueInEnvironment
                (context,sStack_1e8,(sysbvm_tuple_t *)&gcFrame,gcFrame.applicationArgumentNode);
      if (bVar5) {
        bVar1 = true;
      }
      else {
        uStack_1d8 = uStack_1d8 + 1;
      }
    }
  }
  if (uStack_1d8 != slotCount) {
    sysbvm_error("Message send is not receiving the expected number of arguments.");
  }
  *(sysbvm_tuple_t *)(functionActivationRecord.jmpbuffer[0].__saved_mask.__val[0xf] + 0x40) =
       gcFrame.analyzedArgument;
  if (*(long *)(*arguments + 0x110) != 0) {
    gcFrame.applicationArgumentValue =
         sysbvm_interpreter_evaluateASTWithEnvironment
                   (context,*(sysbvm_tuple_t *)(*arguments + 0x110),(sysbvm_tuple_t)gcFrame.sendNode
                   );
  }
  gcFrame.applicationArgumentValue =
       sysbvm_type_canonicalizeDependentResultType(context,gcFrame.applicationArgumentValue);
  *(sysbvm_tuple_t *)(functionActivationRecord.jmpbuffer[0].__saved_mask.__val[0xf] + 0x20) =
       gcFrame.applicationArgumentValue;
  sVar3 = sysbvm_tuple_bitflags_decode
                    (*(sysbvm_tuple_t *)
                      (functionActivationRecord.jmpbuffer[0].__saved_mask.__val[0xf] + 0x60));
  sVar4 = sysbvm_tuple_bitflags_encode(sVar3 | 3);
  *(sysbvm_tuple_t *)(functionActivationRecord.jmpbuffer[0].__saved_mask.__val[0xf] + 0x60) = sVar4;
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&argumentNodeCount);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&gcFrameRecord.roots);
  sVar4 = sysbvm_astFunctionApplicationNode_optimizePureApplication
                    (context,(sysbvm_astFunctionApplicationNode_t **)(arguments + 1));
  return sVar4;
}

Assistant:

static sysbvm_tuple_t sysbvm_dependentFunctionType_primitiveAnalyzeAndTypeCheckMessageSendNode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 3) sysbvm_error_argumentCountMismatch(3, argumentCount);

    sysbvm_dependentFunctionType_t **dependentFunctionType = (sysbvm_dependentFunctionType_t **)&arguments[0];
    sysbvm_tuple_t *node = &arguments[1];
    sysbvm_tuple_t *environment = &arguments[2];

    struct {
        sysbvm_astMessageSendNode_t *sendNode;

        sysbvm_tuple_t applicationEnvironment;
        sysbvm_tuple_t argumentNode;

        sysbvm_tuple_t applicationArgumentNode;
        sysbvm_tuple_t applicationArgumentValue;
        sysbvm_tuple_t resultType;

        sysbvm_tuple_t analyzedArgument;
        sysbvm_tuple_t analyzedArguments;
        sysbvm_tuple_t expectedArgumentType;
    } gcFrame = {
        .sendNode = (sysbvm_astMessageSendNode_t*)*node,
    };

    sysbvm_stackFrameFunctionActivationRecord_t functionActivationRecord = {
        .type = SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION,
    };
    sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t*)&functionActivationRecord); 
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.sendNode->super.sourcePosition);

    gcFrame.applicationEnvironment = sysbvm_functionActivationEnvironment_createForDependentFunctionType(context, SYSBVM_NULL_TUPLE, (sysbvm_tuple_t)*dependentFunctionType);

    size_t argumentNodeCount = sysbvm_array_getSize((*dependentFunctionType)->argumentNodes);
    
    size_t directEvaluationArgumentNodeCount = argumentNodeCount;

    size_t applicationArgumentCount = sysbvm_array_getSize(gcFrame.sendNode->arguments);
    size_t sourceArgumentIndex = 0;
    bool hasAnalyzedReceiver = false;

    gcFrame.analyzedArguments = sysbvm_array_create(context, applicationArgumentCount);
    for(size_t i = 0; i < directEvaluationArgumentNodeCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at((*dependentFunctionType)->argumentNodes, i);
        if(sysbvm_astArgumentNode_isForAll(argumentNodeCount))
        {
            sysbvm_error("TODO: Support forall argument types");
        }
        else
        {
            bool isReceiverArgument = !hasAnalyzedReceiver && gcFrame.sendNode->receiver;
            if(isReceiverArgument)
            {
                gcFrame.applicationArgumentNode = gcFrame.sendNode->receiver;
            }
            else
            {
                if(sourceArgumentIndex >= applicationArgumentCount)
                    sysbvm_error("Message send is missing required arguments.");
                gcFrame.applicationArgumentNode = sysbvm_array_at(gcFrame.sendNode->arguments, sourceArgumentIndex);
            }

            gcFrame.expectedArgumentType = sysbvm_interpreter_evaluateArgumentNodeTypeInEnvironment(context, gcFrame.argumentNode, &gcFrame.applicationEnvironment);
            gcFrame.analyzedArgument = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.applicationArgumentNode, gcFrame.expectedArgumentType, *environment);
            if(isReceiverArgument)
                gcFrame.sendNode->receiver = gcFrame.analyzedArgument;
            else
                sysbvm_array_atPut(gcFrame.analyzedArguments, sourceArgumentIndex, gcFrame.analyzedArgument);
            gcFrame.applicationArgumentValue = sysbvm_dependentFunctionType_getOrCreateDependentApplicationValueForNode(context, gcFrame.analyzedArgument);
            sysbvm_interpreter_bindArgumentNodeValueInEnvironment(context, i, &gcFrame.applicationEnvironment, gcFrame.applicationArgumentValue);
            if(isReceiverArgument)
                hasAnalyzedReceiver = true;
            else
                ++sourceArgumentIndex;
        }
    }

    if(sourceArgumentIndex != applicationArgumentCount)
        sysbvm_error("Message send is not receiving the expected number of arguments.");

    gcFrame.sendNode->arguments = gcFrame.analyzedArguments;

    if((*dependentFunctionType)->resultTypeNode)
        gcFrame.resultType = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*dependentFunctionType)->resultTypeNode, gcFrame.applicationEnvironment);
    gcFrame.resultType = sysbvm_type_canonicalizeDependentResultType(context, gcFrame.resultType);
    gcFrame.sendNode->super.analyzedType = gcFrame.resultType;
    gcFrame.sendNode->applicationFlags = sysbvm_tuple_bitflags_encode(sysbvm_tuple_bitflags_decode(gcFrame.sendNode->applicationFlags)
        | SYSBVM_FUNCTION_APPLICATION_FLAGS_NO_TYPECHECK | SYSBVM_FUNCTION_APPLICATION_FLAGS_VARIADIC_EXPANDED);

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t*)&functionActivationRecord);  
    return sysbvm_astFunctionApplicationNode_optimizePureApplication(context, (sysbvm_astFunctionApplicationNode_t**)node);
}